

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

void fai_save(faidx_t *fai,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  kh_s_t *pkVar3;
  char *__s2;
  khint32_t *pkVar4;
  faidx1_t *pfVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  
  if (0 < fai->n) {
    lVar14 = 0;
    do {
      pkVar3 = fai->hash;
      __s2 = fai->name[lVar14];
      uVar1 = pkVar3->n_buckets;
      uVar9 = 0;
      if (uVar1 != 0) {
        uVar13 = (uint)*__s2;
        if (*__s2 == '\0') {
          uVar13 = 0;
        }
        else {
          cVar6 = __s2[1];
          if (cVar6 != '\0') {
            pcVar11 = __s2 + 2;
            do {
              uVar13 = (int)cVar6 + uVar13 * 0x1f;
              cVar6 = *pcVar11;
              pcVar11 = pcVar11 + 1;
            } while (cVar6 != '\0');
          }
        }
        uVar13 = uVar13 & uVar1 - 1;
        pkVar4 = pkVar3->flags;
        iVar15 = 1;
        uVar12 = uVar13;
        do {
          uVar2 = pkVar4[uVar12 >> 4];
          bVar10 = (char)uVar12 * '\x02' & 0x1e;
          uVar7 = uVar2 >> bVar10;
          uVar9 = uVar1;
          if (((uVar7 & 2) != 0) ||
             (((uVar7 & 1) == 0 && (iVar8 = strcmp(pkVar3->keys[uVar12],__s2), iVar8 == 0)))) {
            if ((uVar2 >> bVar10 & 3) == 0) {
              uVar9 = uVar12;
            }
            break;
          }
          uVar12 = uVar12 + iVar15 & uVar1 - 1;
          iVar15 = iVar15 + 1;
        } while (uVar12 != uVar13);
      }
      pfVar5 = pkVar3->vals;
      fprintf((FILE *)fp,"%s\t%d\t%lld\t%d\t%d\n",__s2,(ulong)(uint)pfVar5[uVar9].len,
              pfVar5[uVar9].offset,(ulong)(uint)pfVar5[uVar9].line_blen,pfVar5[uVar9].line_len);
      lVar14 = lVar14 + 1;
    } while (lVar14 < fai->n);
  }
  return;
}

Assistant:

void fai_save(const faidx_t *fai, FILE *fp)
{
    khint_t k;
    int i;
    for (i = 0; i < fai->n; ++i) {
        faidx1_t x;
        k = kh_get(s, fai->hash, fai->name[i]);
        x = kh_value(fai->hash, k);
#ifdef _WIN32
        fprintf(fp, "%s\t%d\t%ld\t%d\t%d\n", fai->name[i], (int)x.len, (long)x.offset, (int)x.line_blen, (int)x.line_len);
#else
        fprintf(fp, "%s\t%d\t%lld\t%d\t%d\n", fai->name[i], (int)x.len, (long long)x.offset, (int)x.line_blen, (int)x.line_len);
#endif
    }
}